

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct64_stage9_avx2(__m256i *u,__m256i *cospim32,__m256i *cospi32,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rnding,int bit)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  __m256i alVar3;
  undefined1 auVar4 [32];
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  undefined1 auVar9 [32];
  __m256i *palVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  
  palVar10 = u;
  for (lVar12 = 0x1e0; lVar12 != 0xe0; lVar12 = lVar12 + -0x20) {
    auVar1 = *(undefined1 (*) [32])((long)*u + lVar12);
    auVar4 = vpaddd_avx2(auVar1,(undefined1  [32])*palVar10);
    auVar9 = vpsubd_avx2((undefined1  [32])*palVar10,auVar1);
    auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
    alVar5 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    auVar1 = vpmaxsd_avx2(auVar9,(undefined1  [32])*clamp_lo);
    auVar1 = vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    *palVar10 = alVar5;
    *(undefined1 (*) [32])((long)*u + lVar12) = auVar1;
    palVar10 = palVar10 + 1;
  }
  alVar5 = *cospim32;
  auVar1 = vpmulld_avx2((undefined1  [32])u[0x14],(undefined1  [32])alVar5);
  alVar2 = *cospi32;
  auVar4 = vpmulld_avx2((undefined1  [32])u[0x1b],(undefined1  [32])alVar2);
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  alVar3 = *rnding;
  auVar1 = vpaddd_avx2((undefined1  [32])alVar3,auVar1);
  alVar6 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  auVar1 = vpmulld_avx2((undefined1  [32])u[0x15],(undefined1  [32])alVar5);
  auVar4 = vpmulld_avx2((undefined1  [32])u[0x1a],(undefined1  [32])alVar2);
  auVar1 = vpaddd_avx2((undefined1  [32])alVar3,auVar1);
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  alVar7 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  auVar1 = vpmulld_avx2((undefined1  [32])u[0x16],(undefined1  [32])alVar5);
  auVar4 = vpmulld_avx2((undefined1  [32])u[0x19],(undefined1  [32])alVar2);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])alVar3);
  auVar1 = vpaddd_avx2(auVar1,auVar4);
  auVar13 = ZEXT416((uint)bit);
  alVar8 = (__m256i)vpsrad_avx2(auVar1,auVar13);
  auVar1 = vpmulld_avx2((undefined1  [32])u[0x17],(undefined1  [32])alVar5);
  auVar4 = vpmulld_avx2((undefined1  [32])u[0x18],(undefined1  [32])alVar2);
  auVar1 = vpaddd_avx2((undefined1  [32])alVar3,auVar1);
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  alVar5 = (__m256i)vpsrad_avx2(auVar1,auVar13);
  auVar1 = vpaddd_avx2((undefined1  [32])u[0x18],(undefined1  [32])u[0x17]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])alVar2);
  auVar1 = vpaddd_avx2((undefined1  [32])alVar3,auVar1);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,auVar13);
  u[0x18] = alVar2;
  auVar1 = vpaddd_avx2((undefined1  [32])u[0x19],(undefined1  [32])u[0x16]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rnding);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,auVar13);
  u[0x19] = alVar2;
  auVar1 = vpaddd_avx2((undefined1  [32])u[0x1a],(undefined1  [32])u[0x15]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rnding);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  u[0x1a] = alVar2;
  auVar1 = vpaddd_avx2((undefined1  [32])u[0x1b],(undefined1  [32])u[0x14]);
  auVar1 = vpmulld_avx2(auVar1,(undefined1  [32])*cospi32);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rnding);
  alVar2 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  u[0x1b] = alVar2;
  u[0x14] = alVar6;
  u[0x15] = alVar7;
  u[0x16] = alVar8;
  u[0x17] = alVar5;
  palVar10 = u + 0x20;
  for (uVar11 = 0x20; uVar11 != 0x28; uVar11 = uVar11 + 1) {
    auVar1 = vpaddd_avx2((undefined1  [32])u[uVar11 ^ 0xf],(undefined1  [32])*palVar10);
    auVar4 = vpsubd_avx2((undefined1  [32])*palVar10,(undefined1  [32])u[uVar11 ^ 0xf]);
    auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
    alVar5 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
    alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    *palVar10 = alVar5;
    u[uVar11 ^ 0xf] = alVar2;
    palVar10 = palVar10 + 1;
  }
  palVar10 = u + 0x30;
  for (uVar11 = 0x30; uVar11 != 0x38; uVar11 = uVar11 + 1) {
    auVar1 = vpaddd_avx2((undefined1  [32])*palVar10,(undefined1  [32])u[uVar11 ^ 0xf]);
    auVar4 = vpsubd_avx2((undefined1  [32])u[uVar11 ^ 0xf],(undefined1  [32])*palVar10);
    auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
    alVar5 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
    alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    u[uVar11 ^ 0xf] = alVar5;
    *palVar10 = alVar2;
    palVar10 = palVar10 + 1;
  }
  return;
}

Assistant:

static inline void idct64_stage9_avx2(__m256i *x, const int32_t *cospi,
                                      const __m256i _r, int8_t cos_bit) {
  (void)cos_bit;
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_avx2(&x[0], &x[15]);
  btf_16_adds_subs_avx2(&x[1], &x[14]);
  btf_16_adds_subs_avx2(&x[2], &x[13]);
  btf_16_adds_subs_avx2(&x[3], &x[12]);
  btf_16_adds_subs_avx2(&x[4], &x[11]);
  btf_16_adds_subs_avx2(&x[5], &x[10]);
  btf_16_adds_subs_avx2(&x[6], &x[9]);
  btf_16_adds_subs_avx2(&x[7], &x[8]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[20], &x[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[21], &x[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[22], &x[25], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[23], &x[24], _r, cos_bit);
  btf_16_adds_subs_avx2(&x[32], &x[47]);
  btf_16_adds_subs_avx2(&x[33], &x[46]);
  btf_16_adds_subs_avx2(&x[34], &x[45]);
  btf_16_adds_subs_avx2(&x[35], &x[44]);
  btf_16_adds_subs_avx2(&x[36], &x[43]);
  btf_16_adds_subs_avx2(&x[37], &x[42]);
  btf_16_adds_subs_avx2(&x[38], &x[41]);
  btf_16_adds_subs_avx2(&x[39], &x[40]);
  btf_16_adds_subs_avx2(&x[63], &x[48]);
  btf_16_adds_subs_avx2(&x[62], &x[49]);
  btf_16_adds_subs_avx2(&x[61], &x[50]);
  btf_16_adds_subs_avx2(&x[60], &x[51]);
  btf_16_adds_subs_avx2(&x[59], &x[52]);
  btf_16_adds_subs_avx2(&x[58], &x[53]);
  btf_16_adds_subs_avx2(&x[57], &x[54]);
  btf_16_adds_subs_avx2(&x[56], &x[55]);
}